

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

bool __thiscall tf::Executor::_invoke_dependent_async_task(Executor *this,Worker *worker,Node *node)

{
  bool bVar1;
  Worker *worker_00;
  char *pcVar2;
  int __c;
  Worker *in_RDX;
  Executor *in_RSI;
  variant<std::function<void_()>,_std::function<void_(tf::Runtime_&)>,_std::function<void_(tf::Runtime_&,_bool)>_>
  *work;
  variant<std::function<void_()>,_std::function<void_(tf::Runtime_&)>,_std::function<void_(tf::Runtime_&,_bool)>_>
  *in_stack_ffffffffffffff98;
  function<void_()> *in_stack_ffffffffffffffa0;
  Node *in_stack_ffffffffffffffd0;
  Executor *this_00;
  
  this_00 = in_RSI;
  worker_00 = (Worker *)
              std::
              get_if<tf::Node::DependentAsync,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                        ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          *)0x1620ee);
  pcVar2 = std::
           variant<std::function<void_()>,_std::function<void_(tf::Runtime_&)>,_std::function<void_(tf::Runtime_&,_bool)>_>
           ::index((variant<std::function<void_()>,_std::function<void_(tf::Runtime_&)>,_std::function<void_(tf::Runtime_&,_bool)>_>
                    *)worker_00,(char *)in_RSI,__c);
  if (pcVar2 == (char *)0x0) {
    _observer_prologue((Executor *)in_RDX,worker_00,in_stack_ffffffffffffffd0);
    std::
    get_if<0ul,std::function<void()>,std::function<void(tf::Runtime&)>,std::function<void(tf::Runtime&,bool)>>
              (in_stack_ffffffffffffff98);
    std::function<void_()>::operator()(in_stack_ffffffffffffffa0);
    _observer_epilogue((Executor *)in_RDX,worker_00,in_stack_ffffffffffffffd0);
  }
  else if (pcVar2 == (char *)0x1) {
    std::
    get_if<1ul,std::function<void()>,std::function<void(tf::Runtime&)>,std::function<void(tf::Runtime&,bool)>>
              (in_stack_ffffffffffffff98);
    bVar1 = _invoke_runtime_task_impl
                      (this_00,in_RDX,(Node *)worker_00,
                       (function<void_(tf::Runtime_&)> *)in_stack_ffffffffffffffd0);
    if (bVar1) {
      return true;
    }
  }
  else if (pcVar2 == (char *)0x2) {
    std::
    get_if<2ul,std::function<void()>,std::function<void(tf::Runtime&)>,std::function<void(tf::Runtime&,bool)>>
              ((variant<std::function<void_()>,_std::function<void_(tf::Runtime_&)>,_std::function<void_(tf::Runtime_&,_bool)>_>
                *)this_00);
    bVar1 = _invoke_runtime_task_impl
                      (this_00,in_RDX,(Node *)worker_00,
                       (function<void_(tf::Runtime_&,_bool)> *)in_stack_ffffffffffffffd0);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_dependent_async_task(Worker& worker, Node* node) {
  auto& work = std::get_if<Node::DependentAsync>(&node->_handle)->work;
  switch(work.index()) {
    // void()
    case 0:
      _observer_prologue(worker, node);
      TF_EXECUTOR_EXCEPTION_HANDLER(worker, node, {
        std::get_if<0>(&work)->operator()();
      });
      _observer_epilogue(worker, node);
    break;
    
    // void(Runtime&) - silent async
    case 1:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<1>(&work))) {
        return true;
      }
    break;

    // void(Runtime&, bool) - async
    case 2:
      if(_invoke_runtime_task_impl(worker, node, *std::get_if<2>(&work))) {
        return true;
      }
    break;
  }
  return false;
}